

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t path_excluded(archive_match *a,wchar_t mbs,void *pathname)

{
  wchar_t *pwVar1;
  wchar_t wVar2;
  int *piVar3;
  void *in_RCX;
  undefined4 in_register_00000034;
  match *pmVar4;
  match *pmVar5;
  bool bVar6;
  char *p;
  char *local_38;
  
  if (a == (archive_match *)0x0) {
    wVar2 = L'\0';
  }
  else {
    pmVar5 = (a->inclusions).first;
    if (pmVar5 == (match *)0x0) {
      bVar6 = true;
    }
    else {
      pmVar4 = (match *)0x0;
      do {
        if (pmVar5->matches == 0) {
          wVar2 = match_path_inclusion(a,pmVar5,mbs,in_RCX);
          if (wVar2 != L'\0') {
            if (wVar2 < L'\0') {
              return wVar2;
            }
            pwVar1 = &(a->inclusions).unmatched_count;
            *pwVar1 = *pwVar1 + L'\xffffffff';
            pmVar5->matches = pmVar5->matches + 1;
            pmVar4 = pmVar5;
          }
        }
        pmVar5 = pmVar5->next;
      } while (pmVar5 != (match *)0x0);
      bVar6 = pmVar4 == (match *)0x0;
    }
    pmVar5 = (match *)&a->exclusions;
    do {
      pmVar5 = pmVar5->next;
      if (pmVar5 == (match *)0x0) {
        if (!bVar6) {
          return L'\0';
        }
        pmVar5 = (a->inclusions).first;
        do {
          if (pmVar5 == (match *)0x0) {
            return (uint)((a->inclusions).first != (match *)0x0);
          }
          if (0 < pmVar5->matches) {
            wVar2 = match_path_inclusion(a,pmVar5,mbs,in_RCX);
            if (wVar2 != L'\0') {
              if (wVar2 < L'\0') {
                return wVar2;
              }
              pmVar5->matches = pmVar5->matches + 1;
              return L'\0';
            }
          }
          pmVar5 = pmVar5->next;
        } while( true );
      }
      wVar2 = archive_mstring_get_mbs(&a->archive,&pmVar5->pattern,&local_38);
      if (wVar2 == L'\0') {
        wVar2 = __archive_pathmatch(local_38,(char *)CONCAT44(in_register_00000034,mbs),L'\x03');
      }
      else {
        piVar3 = __errno_location();
        wVar2 = L'\0';
        if (*piVar3 == 0xc) {
          archive_set_error(&a->archive,0xc,"No memory");
          (a->archive).state = 0x8000;
          wVar2 = L'\xffffffe2';
        }
      }
    } while (wVar2 == L'\0');
  }
  return wVar2;
}

Assistant:

static int
path_excluded(struct archive_match *a, int mbs, const void *pathname)
{
	struct match *match;
	struct match *matched;
	int r;

	if (a == NULL)
		return (0);

	/* Mark off any unmatched inclusions. */
	/* In particular, if a filename does appear in the archive and
	 * is explicitly included and excluded, then we don't report
	 * it as missing even though we don't extract it.
	 */
	matched = NULL;
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		if (match->matches == 0 &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			a->inclusions.unmatched_count--;
			match->matches++;
			matched = match;
		}
	}

	/* Exclusions take priority */
	for (match = a->exclusions.first; match != NULL;
	    match = match->next){
		r = match_path_exclusion(a, match, mbs, pathname);
		if (r)
			return (r);
	}

	/* It's not excluded and we found an inclusion above, so it's
	 * included. */
	if (matched != NULL)
		return (0);


	/* We didn't find an unmatched inclusion, check the remaining ones. */
	for (match = a->inclusions.first; match != NULL;
	    match = match->next){
		/* We looked at previously-unmatched inclusions already. */
		if (match->matches > 0 &&
		    (r = match_path_inclusion(a, match, mbs, pathname)) != 0) {
			if (r < 0)
				return (r);
			match->matches++;
			return (0);
		}
	}

	/* If there were inclusions, default is to exclude. */
	if (a->inclusions.first != NULL)
	    return (1);

	/* No explicit inclusions, default is to match. */
	return (0);
}